

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_dpb.c
# Opt level: O1

void free_dpb(H264_DpbBuf_t *p_Dpb)

{
  h264d_video_ctx_t *phVar1;
  ulong uVar2;
  
  phVar1 = p_Dpb->p_Vid;
  if (p_Dpb->fs != (h264_frame_store_t **)0x0) {
    if (p_Dpb->allocated_size != 0) {
      uVar2 = 0;
      do {
        free_frame_store(phVar1->p_Dec,p_Dpb->fs[uVar2]);
        p_Dpb->fs[uVar2] = (h264_frame_store_t *)0x0;
        uVar2 = uVar2 + 1;
      } while (uVar2 < p_Dpb->allocated_size);
    }
    if (p_Dpb->fs != (h264_frame_store_t **)0x0) {
      mpp_osal_free("free_dpb",p_Dpb->fs);
    }
    p_Dpb->fs = (h264_frame_store_t **)0x0;
  }
  if (p_Dpb->fs_ref != (h264_frame_store_t **)0x0) {
    mpp_osal_free("free_dpb",p_Dpb->fs_ref);
  }
  p_Dpb->fs_ref = (h264_frame_store_t **)0x0;
  if (p_Dpb->fs_ltref != (h264_frame_store_t **)0x0) {
    mpp_osal_free("free_dpb",p_Dpb->fs_ltref);
  }
  p_Dpb->fs_ltref = (h264_frame_store_t **)0x0;
  if (p_Dpb->fs_ilref != (h264_frame_store_t **)0x0) {
    free_frame_store(phVar1->p_Dec,*p_Dpb->fs_ilref);
    *p_Dpb->fs_ilref = (h264_frame_store_t *)0x0;
    if (p_Dpb->fs_ilref != (h264_frame_store_t **)0x0) {
      mpp_osal_free("free_dpb",p_Dpb->fs_ilref);
    }
    p_Dpb->fs_ilref = (h264_frame_store_t **)0x0;
  }
  p_Dpb->last_output_poc = -0x80000000;
  p_Dpb->last_output_view_id = -1;
  p_Dpb->init_done = 0;
  if (phVar1->no_ref_pic != (H264_StorePic_t *)0x0) {
    free_storable_picture(phVar1->p_Dec,phVar1->no_ref_pic);
    phVar1->no_ref_pic = (h264_store_pic_t *)0x0;
  }
  return;
}

Assistant:

void free_dpb(H264_DpbBuf_t *p_Dpb)
{
    RK_U32 i = 0;
    H264dVideoCtx_t *p_Vid = p_Dpb->p_Vid;

    if (p_Dpb->fs) {
        for (i = 0; i < p_Dpb->allocated_size; i++) {
            free_frame_store(p_Vid->p_Dec, p_Dpb->fs[i]);
            p_Dpb->fs[i] = NULL;
        }
        MPP_FREE(p_Dpb->fs);
    }
    MPP_FREE(p_Dpb->fs_ref);
    MPP_FREE(p_Dpb->fs_ltref);
    if (p_Dpb->fs_ilref) {
        for (i = 0; i < 1; i++) {
            free_frame_store(p_Vid->p_Dec, p_Dpb->fs_ilref[i]);
            p_Dpb->fs_ilref[i] = NULL;
        }
        MPP_FREE(p_Dpb->fs_ilref);
    }
    p_Dpb->last_output_view_id = -1;
    p_Dpb->last_output_poc = INT_MIN;
    p_Dpb->init_done = 0;
    if (p_Vid->no_ref_pic) {
        free_storable_picture(p_Vid->p_Dec, p_Vid->no_ref_pic);
        p_Vid->no_ref_pic = NULL;
    }
}